

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::deleteAfterNode(LinkedList<char> *this,ListNode<char> *_previous)

{
  ListNode<char> *pLVar1;
  ListNode<char> *_current;
  ListNode<char> *_previous_local;
  LinkedList<char> *this_local;
  
  pLVar1 = ListNode<char>::next(_previous);
  ListNode<char>::deleteAfter(_previous);
  if (pLVar1 != (ListNode<char> *)0x0) {
    (*pLVar1->_vptr_ListNode[1])();
  }
  if (pLVar1 == this->_tail) {
    this->_tail = _previous;
  }
  this->_size = this->_size - 1;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::deleteAfterNode(ListNode<T>* _previous){
        ListNode<T>* _current = _previous->next();
        _previous->deleteAfter();
        delete _current;
        if (_current == _tail) {
            _tail = _previous;
        }
        _size--;
        return this;
    }